

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_lib.c
# Opt level: O0

int EVP_PKEY_set_octet_string_param(EVP_PKEY *pkey,char *key_name,uchar *buf,size_t bsize)

{
  long in_RSI;
  OSSL_PARAM params [2];
  EVP_PKEY *pkey_00;
  size_t in_stack_ffffffffffffff30;
  undefined1 *__dest;
  void *in_stack_ffffffffffffff38;
  char *in_stack_ffffffffffffff40;
  undefined1 local_a0 [40];
  int local_4;
  
  if (in_RSI == 0) {
    local_4 = 0;
  }
  else {
    pkey_00 = (EVP_PKEY *)&stack0xffffffffffffff88;
    OSSL_PARAM_construct_octet_string
              (in_stack_ffffffffffffff40,in_stack_ffffffffffffff38,in_stack_ffffffffffffff30);
    memcpy(pkey_00,local_a0,0x28);
    __dest = &stack0xffffffffffffffb0;
    OSSL_PARAM_construct_end();
    memcpy(__dest,&stack0xffffffffffffff38,0x28);
    local_4 = EVP_PKEY_set_params(pkey_00,(OSSL_PARAM *)0x27682e);
  }
  return local_4;
}

Assistant:

int EVP_PKEY_set_octet_string_param(EVP_PKEY *pkey, const char *key_name,
                                    const unsigned char *buf, size_t bsize)
{
    OSSL_PARAM params[2];

    if (key_name == NULL)
        return 0;

    params[0] = OSSL_PARAM_construct_octet_string(key_name,
                                                  (unsigned char *)buf, bsize);
    params[1] = OSSL_PARAM_construct_end();
    return EVP_PKEY_set_params(pkey, params);
}